

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  uint uVar1;
  PatchList PVar2;
  ulong uVar3;
  
  uVar3 = (ulong)b >> 0x20;
  if (a.begin != 0) {
    uVar3 = (ulong)a >> 0x20;
    if (b.begin == 0) {
      b = (Frag)((ulong)a & 0xffffffff);
    }
    else {
      uVar1 = AllocInst(this,1);
      if ((int)uVar1 < 0) {
        uVar3 = 0;
        b.begin = 0;
        b.end.p = 0;
      }
      else {
        Prog::Inst::InitAlt(this->inst_ + uVar1,a.begin,b.begin);
        PVar2 = PatchList::Append(this->inst_,a.end.p,b.end.p);
        uVar3 = (ulong)PVar2.p;
        b.end.p = 0;
        b.begin = uVar1;
      }
    }
  }
  return (Frag)((ulong)b & 0xffffffff | uVar3 << 0x20);
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_, a.end, b.end));
}